

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void fmt::v5::internal::
     handle_dynamic_spec<fmt::v5::internal::precision_checker,int,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
               (int *value,arg_ref<wchar_t> ref,
               basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>
               *ctx)

{
  type tVar1;
  error_handler *this;
  int iVar2;
  error_handler local_82;
  error_handler local_81;
  precision_checker<fmt::v5::internal::error_handler> local_80;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_1
  local_78;
  undefined8 local_68;
  undefined8 uStack_60;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_1
  local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>_1
  local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  if (ref.kind == NAME) {
    basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>
    ::get_arg((format_arg *)&local_58.string,ctx,(basic_string_view<wchar_t>)ref.field_1.name);
    local_68 = local_48;
    uStack_60 = uStack_40;
    local_78.long_long_value = local_58.long_long_value;
    local_78.string.size = local_58.string.size;
    local_80.handler_ = &local_82;
    tVar1 = visit_format_arg<fmt::v5::internal::precision_checker<fmt::v5::internal::error_handler>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
                      (&local_80,
                       (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                        *)&local_78.string);
    iVar2 = (int)tVar1;
    if ((tVar1 & 0xffffffff80000000) == 0) goto LAB_0013fdca;
    this = &local_82;
  }
  else {
    if (ref.kind != INDEX) {
      return;
    }
    context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
    ::do_get_arg((format_arg *)&local_38.string,
                 &ctx->
                  super_context_base<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>,_wchar_t>
                 ,ref.field_1.index);
    local_68 = local_28;
    uStack_60 = uStack_20;
    local_78.long_long_value = local_38.long_long_value;
    local_78.string.size = local_38.string.size;
    local_80.handler_ = &local_81;
    tVar1 = visit_format_arg<fmt::v5::internal::precision_checker<fmt::v5::internal::error_handler>,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>>,wchar_t>>
                      (&local_80,
                       (basic_format_arg<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
                        *)&local_78.string);
    iVar2 = (int)tVar1;
    if ((tVar1 & 0xffffffff80000000) == 0) goto LAB_0013fdca;
    this = &local_81;
  }
  iVar2 = (int)tVar1;
  error_handler::on_error(this,"number is too big");
LAB_0013fdca:
  *value = iVar2;
  return;
}

Assistant:

void handle_dynamic_spec(
    Spec &value, arg_ref<typename Context::char_type> ref, Context &ctx) {
  typedef typename Context::char_type char_type;
  switch (ref.kind) {
  case arg_ref<char_type>::NONE:
    break;
  case arg_ref<char_type>::INDEX:
    internal::set_dynamic_spec<Handler>(
          value, ctx.get_arg(ref.index), ctx.error_handler());
    break;
  case arg_ref<char_type>::NAME:
    internal::set_dynamic_spec<Handler>(
          value, ctx.get_arg({ref.name.value, ref.name.size}),
          ctx.error_handler());
    break;
  }
}